

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::SetPropertyWithAttributes
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  Type *pTVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  uint32 index;
  int iVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  JavascriptString **ppJVar10;
  DictionaryTypeHandlerBase<int> *pDVar11;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this_00;
  ScriptContext *this_01;
  Var pvVar12;
  PropertyRecord *local_68;
  PropertyRecord *propertyRecord;
  int propertyIndex;
  PropertyValueInfo *local_50;
  undefined4 *local_48;
  Var local_40;
  SimpleDictionaryPropertyDescriptor<int> *local_38;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  
  local_50 = info;
  local_40 = value;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x92a,"(instance)","instance");
    if (!bVar4) goto LAB_00c6ddf2;
    *puVar9 = 0;
  }
  this_01 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  _propertyIndex = this_01;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x92f,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar4) goto LAB_00c6ddf2;
    *puVar9 = 0;
    this_01 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
  }
  local_68 = ScriptContext::GetPropertyName(this_01,propertyId);
  bVar4 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_68,&local_38);
  if (!bVar4) {
    if (local_68->isNumeric != true) {
      BVar8 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
              AddProperty<Js::PropertyRecord_const*>
                        ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,
                         instance,local_68,local_40,attributes,local_50,flags,possibleSideEffects);
      return BVar8;
    }
    index = PropertyRecord::GetNumericValue(local_68);
    BVar8 = DynamicTypeHandler::SetItemWithAttributes
                      (&this->super_DynamicTypeHandler,instance,index,local_40,attributes);
    return BVar8;
  }
  bVar5 = local_38->Attributes;
  if ((bVar5 & 0x10) != (attributes & 0x10)) {
    pDVar11 = ConvertToDictionaryType(this,instance);
    iVar7 = (*(pDVar11->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3a])
                      (pDVar11,instance,(ulong)(uint)propertyId,local_40,(ulong)attributes,local_50,
                       (ulong)flags,(ulong)possibleSideEffects);
    return iVar7;
  }
  if ((bVar5 & 0x18) == 8) {
    bVar5 = (this->super_DynamicTypeHandler).flags;
    if ((bVar5 & 4) != 0) goto LAB_00c6db60;
    pTVar1 = (instance->super_RecyclableObject).type.ptr;
    if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
      if (((bVar5 & 0x10) != 0) || (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01')
         ) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_48 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *local_48 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x960,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar4) goto LAB_00c6ddf2;
        *local_48 = 0;
      }
      DynamicObject::ChangeType(instance);
    }
    if (((this->field_0x28 & 2) != 0) &&
       (bVar4 = SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>::
                TryUndeleteProperty((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>
                                     *)this,instance,local_38->propertyIndex,(int *)&propertyRecord)
       , bVar4)) {
      ppJVar10 = JsUtil::
                 BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetKeyAt((this->propertyMap).ptr,(int)propertyRecord);
      bVar4 = PropertyRecordStringHashComparer<Js::JavascriptString_*>::Equals(*ppJVar10,local_68);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_48 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *local_48 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x96b,
                                    "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord))"
                                    ,
                                    "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord)"
                                   );
        if (!bVar4) goto LAB_00c6ddf2;
        *local_48 = 0;
      }
      local_38 = JsUtil::
                 BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetReferenceAt((this->propertyMap).ptr,(int)propertyRecord);
    }
    bVar4 = SupportsSwitchingToUnordered(this,_propertyIndex);
    if (bVar4) {
      this->numDeletedProperties = this->numDeletedProperties + 0xff;
    }
    ScriptContext::InvalidateProtoCaches(_propertyIndex,propertyId);
    local_38->Attributes = '\a';
    bVar5 = 7;
  }
  if (bVar5 != attributes) {
    bVar5 = (this->super_DynamicTypeHandler).flags;
    if ((bVar5 & 4) != 0) {
LAB_00c6db60:
      this_00 = ConvertToNonSharedSimpleDictionaryType(this,instance);
      BVar8 = SetPropertyWithAttributes
                        (this_00,instance,propertyId,local_40,attributes,local_50,flags,
                         possibleSideEffects);
      return BVar8;
    }
    pTVar1 = (instance->super_RecyclableObject).type.ptr;
    if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
      if (((bVar5 & 0x10) != 0) || (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01')
         ) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_48 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *local_48 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x997,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar4) goto LAB_00c6ddf2;
        *local_48 = 0;
      }
      DynamicObject::ChangeType(instance);
    }
    local_38->Attributes = attributes;
  }
  pvVar12 = local_40;
  if (local_38->propertyIndex == -1) goto LAB_00c6dd4e;
  pRVar2 = (this->singletonInstance).ptr;
  if (pRVar2 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    bVar4 = false;
  }
  else if ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef == instance) {
    bVar4 = true;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x9a5,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar4) goto LAB_00c6ddf2;
    *puVar9 = 0;
    bVar4 = false;
  }
  pvVar12 = local_40;
  if ((*(byte *)local_38 & 2) == 0) {
    if ((((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
        (*(byte *)local_38 = *(byte *)local_38 | 2, bVar4)) &&
       ((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
        PropertyOperation_None && 0xf < (uint)propertyId)) {
      if (((this->super_DynamicTypeHandler).flags & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x9af,"(!GetIsShared())","!GetIsShared()");
        if (!bVar4) goto LAB_00c6ddf2;
        *puVar9 = 0;
      }
      if (pvVar12 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x9b0,"(value != nullptr)","value != nullptr");
        if (!bVar4) goto LAB_00c6ddf2;
        *puVar9 = 0;
      }
      BVar8 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
      if (BVar8 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x9b2,"(!instance->IsExternal())","!instance->IsExternal()");
        if (!bVar4) {
LAB_00c6ddf2:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
      }
      bVar4 = VarIs<Js::JavascriptFunction>(pvVar12);
      if (bVar4) {
        bVar4 = DynamicTypeHandler::ShouldFixMethodProperties();
LAB_00c6ddd0:
        bVar5 = *(byte *)local_38;
        if (bVar4 == false) goto LAB_00c6dde4;
        bVar6 = 4;
      }
      else {
        bVar4 = DynamicTypeHandler::ShouldFixDataProperties();
        if (bVar4) {
          bVar4 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,propertyId,pvVar12);
          goto LAB_00c6ddd0;
        }
        bVar5 = *(byte *)local_38;
LAB_00c6dde4:
        bVar6 = 0;
      }
      *(byte *)local_38 = bVar5 & 0xfb | bVar6;
    }
  }
  else {
    SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
    InvalidateFixedField<Js::PropertyRecord_const*>
              ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,local_68,
               local_38,(((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr);
  }
  pvVar12 = local_40;
  DynamicTypeHandler::SetSlotUnchecked(instance,local_38->propertyIndex,local_40);
  if (local_50 != (PropertyValueInfo *)0x0) {
    local_50->m_instance = &instance->super_RecyclableObject;
    local_50->m_propertyIndex = 0xffff;
    local_50->m_attributes = '\0';
    local_50->flags = InlineCacheNoFlags;
  }
LAB_00c6dd4e:
  if ((local_38->Attributes & 1) != 0) {
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
  }
  Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::WriteBarrierSet
            ((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
             &propertyRecord,
             &((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
              typesWithOnlyWritablePropertyProtoChain);
  PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
            ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)
             CONCAT44(propertyRecord._4_4_,(int)propertyRecord),&this->super_DynamicTypeHandler,
             local_38->Attributes,propertyId,_propertyIndex);
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,instance,propertyId,pvVar12,possibleSideEffects);
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        AnalysisAssert(instance);
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & PropertyOperation_ThrowIfNotExtensible) != 0;

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if ((attributes & PropertyLetConstGlobal) != (descriptor->Attributes & PropertyLetConstGlobal))
            {
                // We have a shadowing case here.  Either a let/const is being declared
                // that shadows an undeclared global property or an undeclared global
                // property is being added after a let/const was already declared.
                //
                // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
                // because we do not want to add another property index field to the
                // property descriptors.  Instead convert to DictionaryTypeHandler
                // where it will reuse one of the getter/setter fields on its
                // property descriptor type.
                //
                // An exception is in the language service that will sometimes execute
                // the glo function twice causing a const or let appear to shadow itself.
                // In this case setting the property is also right.
                return
                    ConvertToDictionaryType(instance)
                        ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
            }

            if (descriptor->Attributes & PropertyDeleted && !(descriptor->Attributes & PropertyLetConstGlobal))
            {
                Assert((descriptor->Attributes & PropertyLetConstGlobal) == 0);
                if(GetIsLocked())
                {
                    return
                        ConvertToNonSharedSimpleDictionaryType(instance)
                            ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
                }
                else if (instance->GetDynamicType()->GetIsLocked())
                {
                    Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                    // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                    instance->ChangeType();
                }

                if(isUnordered)
                {
                    TPropertyIndex propertyIndex;
                    if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                    {
                        Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord));
                        descriptor = propertyMap->GetReferenceAt(propertyIndex);
                    }
                }

                if (IsNotExtensibleSupported)
                {
                    bool isForce = (flags & PropertyOperation_Force) != 0;
                    if (!isForce)
                    {
                        if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                        {
                            return FALSE;
                        }
                    }
                }

                if(SupportsSwitchingToUnordered(scriptContext))
                {
                    --numDeletedProperties;
                }
                scriptContext->InvalidateProtoCaches(propertyId);
                descriptor->Attributes = PropertyDynamicTypeDefaults;
            }

            if (descriptor->Attributes != attributes)
            {
                if (GetIsLocked())
                {
                    return
                        ConvertToNonSharedSimpleDictionaryType(instance)
                            ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
                }
                else
                {
                    if (instance->GetDynamicType()->GetIsLocked())
                    {
                        Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                        // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                        instance->ChangeType();
                    }

                    descriptor->Attributes = attributes;
                }
            }

            if (descriptor->propertyIndex != NoSlots)
            {
#if ENABLE_FIXED_FIELDS
                DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
                Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
                if (!descriptor->isInitialized)
                {
                    if ((flags & PropertyOperation_PreInit) == 0)
                    {
                        // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                        // some other special illegal value (for let or const), currently == null.
                        descriptor->isInitialized = true;
                        if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) && (flags & (PropertyOperation_SpecialValue | PropertyOperation_NonFixedValue)) == 0)
                        {
                            Assert(!GetIsShared());
                            Assert(value != nullptr);
                            // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                            Assert(!instance->IsExternal());
                            descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                        }
                    }
                }
                else
                {
                    InvalidateFixedField(propertyRecord, descriptor, instance->GetScriptContext());
                }
#endif
                SetSlotUnchecked(instance, descriptor->propertyIndex, value);

                if (!descriptor->IsOrMayBecomeFixed())
                {
                    SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
                }
                else
                {
                    PropertyValueInfo::SetNoCache(info, instance);
                }
            }

            if (descriptor->Attributes & PropertyEnumerable)
            {
                instance->SetHasNoEnumerableProperties(false);
            }

            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptor->Attributes, propertyId, scriptContext);

            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyRecord. May create objectArray.
        if (propertyRecord->IsNumeric())
        {
            return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetItemWithAttributes(instance, propertyRecord->GetNumericValue(), value, attributes);
        }

        return this->AddProperty(instance, propertyRecord, value, attributes, info, flags, possibleSideEffects);
    }